

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  int iVar1;
  ostream *poVar2;
  byte in_SIL;
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  GLint local_74;
  TransientContextLock *this_00;
  GLint local_64;
  TransientContextLock *in_stack_ffffffffffffffa0;
  
  if (((in_SIL & 1) != (*(byte *)(in_RDI + 0x16) & 1)) &&
     (*(byte *)(in_RDI + 0x16) = in_SIL & 1, *(int *)(in_RDI + 0x10) != 0)) {
    GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffffa0);
    priv::TextureSaver::TextureSaver((TextureSaver *)0x2abe73);
    if ((setRepeated(bool)::textureEdgeClamp == '\0') &&
       (iVar1 = __cxa_guard_acquire(&setRepeated(bool)::textureEdgeClamp), iVar1 != 0)) {
      setRepeated::textureEdgeClamp = SF_GLAD_GL_SGIS_texture_edge_clamp != 0;
      __cxa_guard_release(&setRepeated(bool)::textureEdgeClamp);
    }
    if ((((*(byte *)(in_RDI + 0x16) & 1) == 0) && ((setRepeated::textureEdgeClamp & 1U) == 0)) &&
       ((setRepeated::warned & 1U) == 0)) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"OpenGL extension SGIS_texture_edge_clamp unavailable");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Artifacts may occur along texture edges");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      setRepeated::warned = true;
    }
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
    if ((*(byte *)(in_RDI + 0x16) & 1) == 0) {
      local_64 = 0x2900;
      if ((setRepeated::textureEdgeClamp & 1U) != 0) {
        local_64 = 0x812f;
      }
    }
    else {
      local_64 = 0x2901;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2802,local_64);
    if ((*(byte *)(in_RDI + 0x16) & 1) == 0) {
      local_74 = 0x2900;
      if ((setRepeated::textureEdgeClamp & 1U) != 0) {
        local_74 = 0x812f;
      }
    }
    else {
      local_74 = 0x2901;
    }
    this_00 = (TransientContextLock *)sf_glad_glTexParameteri;
    (*sf_glad_glTexParameteri)(0xde1,0x2803,local_74);
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x2ac08a);
    GlResource::TransientContextLock::~TransientContextLock(this_00);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}